

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

Vector * Utils::SolveUpperTriangle(Vector *__return_storage_ptr__,Matrix *m,Vector *b)

{
  double dVar1;
  size_type __n;
  reference pvVar2;
  const_reference pvVar3;
  double dVar4;
  int local_44;
  double dStack_40;
  int j;
  double sum;
  int i;
  allocator<double> local_26;
  undefined1 local_25;
  int local_24;
  Vector *pVStack_20;
  int n;
  Vector *b_local;
  Matrix *m_local;
  Vector *x;
  
  pVStack_20 = b;
  b_local = (Vector *)m;
  m_local = (Matrix *)__return_storage_ptr__;
  local_24 = Matrix::GetCols(m);
  local_25 = 0;
  __n = (size_type)local_24;
  std::allocator<double>::allocator(&local_26);
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,__n,&local_26);
  std::allocator<double>::~allocator(&local_26);
  local_44 = local_24;
  while (sum._0_4_ = local_44 + -1, -1 < sum._0_4_) {
    dStack_40 = 0.0;
    for (; local_44 < local_24; local_44 = local_44 + 1) {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         (__return_storage_ptr__,(long)local_44);
      dVar1 = *pvVar2;
      dVar4 = Matrix::operator()((Matrix *)b_local,sum._0_4_,local_44);
      dStack_40 = dVar1 * dVar4 + dStack_40;
    }
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pVStack_20,(long)sum._0_4_);
    dVar1 = *pvVar3;
    dVar4 = Matrix::operator()((Matrix *)b_local,sum._0_4_,sum._0_4_);
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       (__return_storage_ptr__,(long)sum._0_4_);
    *pvVar2 = (dVar1 - dStack_40) / dVar4;
    local_44 = sum._0_4_;
  }
  return __return_storage_ptr__;
}

Assistant:

Vector Utils::SolveUpperTriangle(const Matrix& m, const Vector& b)
{
    const int n = m.GetCols();
    Vector x(n);

    for (int i = n - 1; i >= 0; --i)
    {
        double sum = 0;
        for (int j = i + 1; j < n; ++j)
        {
            sum += x[j] * m(i, j);
        }
        x[i] = (b[i] - sum) / m(i, i);
    }

    return x;
}